

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

ostream * slang::operator<<(ostream *os,logic_t *rhs)

{
  char *pcVar1;
  
  if (rhs->value == '@') {
    pcVar1 = "z";
  }
  else {
    if (rhs->value != 0x80) {
      std::ostream::_M_insert<unsigned_long>((ulong)os);
      return os;
    }
    pcVar1 = "x";
  }
  std::operator<<(os,pcVar1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const logic_t& rhs) {
    if (rhs.value == logic_t::x.value)
        os << "x";
    else if (rhs.value == logic_t::z.value)
        os << "z";
    else
        os << (uint32_t)rhs.value;
    return os;
}